

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O3

LispPTR N_OP_fgreaterp(LispPTR parg1,LispPTR parg2)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  LispPTR LVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = (ulong)parg2;
  uVar2 = (ulong)parg1;
  if ((parg1 & 0xfff0000) == 0xf0000) {
    fVar6 = (float)(int)(parg1 | 0xffff0000);
LAB_00121a40:
    if ((parg2 & 0xfff0000) == 0xf0000) {
      fVar5 = (float)(int)(parg2 | 0xffff0000);
    }
    else if ((parg2 & 0xfff0000) == 0xe0000) {
      fVar5 = (float)(parg2 & 0xffff);
    }
    else {
      uVar3 = *(ushort *)((ulong)(parg2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar3 == 2) {
        if ((parg2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        fVar5 = (float)*(int *)(Lisp_world + uVar1);
      }
      else {
        if (uVar3 != 3) goto LAB_00121acc;
        if ((parg2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        fVar5 = *(float *)(Lisp_world + uVar1);
      }
    }
    LVar4 = 0x4c;
    if (fVar6 <= fVar5) {
      LVar4 = 0;
    }
  }
  else {
    if ((parg1 & 0xfff0000) == 0xe0000) {
      fVar6 = (float)(parg1 & 0xffff);
      goto LAB_00121a40;
    }
    uVar3 = *(ushort *)((ulong)(parg1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 2) {
      if ((parg1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      fVar6 = (float)*(int *)(Lisp_world + uVar2);
      goto LAB_00121a40;
    }
    if (uVar3 == 3) {
      if ((parg1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      fVar6 = *(float *)(Lisp_world + uVar2);
      goto LAB_00121a40;
    }
LAB_00121acc:
    MachineState.errorexit = 1;
    LVar4 = 0xffffffff;
    MachineState.tosvalue = parg2;
  }
  return LVar4;
}

Assistant:

LispPTR N_OP_fgreaterp(LispPTR parg1, LispPTR parg2) {
  float arg1, arg2;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);
}